

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall
SuiteMessageTests::TestmassQuoteParseGetString::RunImpl(TestmassQuoteParseGetString *this)

{
  char **ppcVar1;
  TestResults *results;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  NoQuoteSets group;
  MassQuote object;
  TestDetails local_278;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  char local_238 [16];
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  size_t local_208;
  int local_200;
  undefined1 local_1f8 [16];
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  size_t local_1a8;
  int local_1a0;
  uint local_188;
  MassQuote local_180;
  
  FIX42::MassQuote::MassQuote(&local_180);
  local_258._0_8_ = local_258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"1","");
  local_1f8._0_8_ = &PTR__FieldBase_00325880;
  local_1f8._8_4_ = 0x75;
  local_1e8._M_p = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_258._0_8_,
             (pointer)(local_258._0_8_ + CONCAT44(local_258._12_4_,local_258._8_4_)));
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8 = 0;
  local_1a0 = 0;
  local_1f8._0_8_ = &PTR__FieldBase_00327338;
  FIX::FieldMap::setField((FieldMap *)&local_180,(FieldBase *)local_1f8,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_1f8);
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_248._M_allocated_capacity + 1));
  }
  FIX42::MassQuote::NoQuoteSets::NoQuoteSets((NoQuoteSets *)local_1f8);
  ppcVar1 = &local_278.filename;
  local_278.suiteName = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"A","");
  local_258._0_8_ = &PTR__FieldBase_00325880;
  local_258._8_4_ = 0x12e;
  local_248._M_allocated_capacity = (size_type)local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_258 + 0x10),local_278.suiteName,
             local_278.testName + (long)local_278.suiteName);
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208 = 0;
  local_200 = 0;
  local_258._0_8_ = &PTR__FieldBase_003273a8;
  local_228._M_p = (pointer)&local_218;
  FIX::FieldMap::setField((FieldMap *)local_1f8,(FieldBase *)local_258,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_258);
  if ((char **)local_278.suiteName != ppcVar1) {
    operator_delete(local_278.suiteName,(ulong)(local_278.filename + 1));
  }
  local_278.suiteName = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"DELL","");
  local_258._0_8_ = &PTR__FieldBase_00325880;
  local_258._8_4_ = 0x137;
  local_248._M_allocated_capacity = (size_type)local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_258 + 0x10),local_278.suiteName,
             local_278.testName + (long)local_278.suiteName);
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208 = 0;
  local_200 = 0;
  local_258._0_8_ = &PTR__FieldBase_003273e0;
  local_228._M_p = (pointer)&local_218;
  FIX::FieldMap::setField((FieldMap *)local_1f8,(FieldBase *)local_258,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_258);
  if ((char **)local_278.suiteName != ppcVar1) {
    operator_delete(local_278.suiteName,(ulong)(local_278.filename + 1));
  }
  FIX::IntField::IntField((IntField *)local_258,0x16c,10);
  local_258._0_8_ = &PTR__FieldBase_00327418;
  FIX::FieldMap::setField((FieldMap *)local_1f8,(FieldBase *)local_258,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_258);
  local_278.suiteName = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"DELL\x01COMP\x01","");
  local_258._0_8_ = &PTR__FieldBase_00325880;
  local_258._8_4_ = 0x16d;
  local_248._M_allocated_capacity = (size_type)local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_258 + 0x10),local_278.suiteName,
             local_278.testName + (long)local_278.suiteName);
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208 = 0;
  local_200 = 0;
  local_258._0_8_ = &PTR__FieldBase_00327450;
  local_228._M_p = (pointer)&local_218;
  FIX::FieldMap::setField((FieldMap *)local_1f8,(FieldBase *)local_258,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_258);
  if ((char **)local_278.suiteName != ppcVar1) {
    operator_delete(local_278.suiteName,(ulong)(local_278.filename + 1));
  }
  FIX::FieldMap::addGroup((int)&local_180,(FieldMap *)(ulong)local_188,SUB81(local_1f8,0));
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  FIX::Message::toString_abi_cxx11_((int)local_258,(int)&local_180,8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_278,*ppTVar3,0x4a5);
  UnitTest::CheckEqual<char[77],std::__cxx11::string>
            (results,(char (*) [77])
                     "8=FIX.4.2\x019=54\x0135=i\x01117=1\x01296=1\x01302=A\x01311=DELL\x01364=10\x01365=DELL\x01COMP\x01\x0110=152\x01"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
             &local_278);
  if ((string *)local_258._0_8_ != (string *)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_248._M_allocated_capacity + 1));
  }
  FIX::FieldMap::~FieldMap((FieldMap *)local_1f8);
  FIX::Message::~Message((Message *)&local_180);
  return;
}

Assistant:

TEST(massQuoteParseGetString)
{
  MassQuote object;

  object.set( QuoteID( "1" ) );

  MassQuote::NoQuoteSets group;
  group.set( QuoteSetID( "A" ) );
  group.set( UnderlyingSymbol( "DELL" ) );
  group.set( EncodedUnderlyingSecurityDescLen( 10 ) );
  group.set( EncodedUnderlyingSecurityDesc( "DELL\001COMP\001" ) );
  object.addGroup( group );

  CHECK_EQUAL(
          ( "8=FIX.4.2\0019=54\00135=i\001117=1\001296=1\001302=A\001"
            "311=DELL\001364=10\001365=DELL\001COMP\001\00110=152\001" ), object.toString() );
}